

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_brusselator1D_imexmri.c
# Opt level: O0

int AdvectionJac(sunrealtype c,SUNMatrix Jac,UserData udata)

{
  long lVar1;
  long lVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  sunrealtype awconst;
  sunrealtype avconst;
  sunrealtype auconst;
  sunindextype i;
  sunrealtype aw;
  sunrealtype av;
  sunrealtype au;
  sunrealtype dx;
  sunindextype N;
  UserData udata_local;
  SUNMatrix Jac_local;
  sunrealtype c_local;
  
  lVar1 = udata->N;
  dVar6 = udata->dx;
  dVar4 = (-udata->au / 2.0) / dVar6;
  dVar5 = (-udata->av / 2.0) / dVar6;
  dVar6 = (-udata->aw / 2.0) / dVar6;
  for (i = 1; i < lVar1 + -1; i = i + 1) {
    lVar2 = *(long *)(*(long *)((long)Jac->content + 0x40) + (i + -1) * 0x18);
    lVar3 = *(long *)((long)Jac->content + 0x28) + 3;
    *(double *)(lVar2 + lVar3 * 8) = -c * dVar4 + *(double *)(lVar2 + lVar3 * 8);
    lVar2 = *(long *)(*(long *)((long)Jac->content + 0x40) + 8 + (i + -1) * 0x18);
    lVar3 = *(long *)((long)Jac->content + 0x28) + 3;
    *(double *)(lVar2 + lVar3 * 8) = -c * dVar5 + *(double *)(lVar2 + lVar3 * 8);
    lVar2 = *(long *)(*(long *)((long)Jac->content + 0x40) + 0x10 + (i + -1) * 0x18);
    lVar3 = *(long *)((long)Jac->content + 0x28) + 3;
    *(double *)(lVar2 + lVar3 * 8) = -c * dVar6 + *(double *)(lVar2 + lVar3 * 8);
    lVar2 = *(long *)(*(long *)((long)Jac->content + 0x40) + (i + 1) * 0x18);
    lVar3 = *(long *)((long)Jac->content + 0x28) + -3;
    *(double *)(lVar2 + lVar3 * 8) = c * dVar4 + *(double *)(lVar2 + lVar3 * 8);
    lVar2 = *(long *)(*(long *)((long)Jac->content + 0x40) + 8 + (i + 1) * 0x18);
    lVar3 = *(long *)((long)Jac->content + 0x28) + -3;
    *(double *)(lVar2 + lVar3 * 8) = c * dVar5 + *(double *)(lVar2 + lVar3 * 8);
    lVar2 = *(long *)(*(long *)((long)Jac->content + 0x40) + 0x10 + (i + 1) * 0x18);
    lVar3 = *(long *)((long)Jac->content + 0x28) + -3;
    *(double *)(lVar2 + lVar3 * 8) = c * dVar6 + *(double *)(lVar2 + lVar3 * 8);
  }
  return 0;
}

Assistant:

static int AdvectionJac(sunrealtype c, SUNMatrix Jac, UserData udata)
{
  /* Set shortcuts */
  sunindextype N = udata->N;
  sunrealtype dx = udata->dx;
  sunrealtype au = udata->au;
  sunrealtype av = udata->av;
  sunrealtype aw = udata->aw;
  sunindextype i;
  sunrealtype auconst, avconst, awconst;
  auconst = -au / TWO / dx;
  avconst = -av / TWO / dx;
  awconst = -aw / TWO / dx;

  /* iterate over intervals, filling in Jacobian of (L*y) using SM_ELEMENT_B
     macro (see sunmatrix_band.h) */
  for (i = 1; i < N - 1; i++)
  {
    SM_ELEMENT_B(Jac, IDX(i, 0), IDX(i - 1, 0)) += -c * auconst;
    SM_ELEMENT_B(Jac, IDX(i, 1), IDX(i - 1, 1)) += -c * avconst;
    SM_ELEMENT_B(Jac, IDX(i, 2), IDX(i - 1, 2)) += -c * awconst;
    SM_ELEMENT_B(Jac, IDX(i, 0), IDX(i + 1, 0)) += c * auconst;
    SM_ELEMENT_B(Jac, IDX(i, 1), IDX(i + 1, 1)) += c * avconst;
    SM_ELEMENT_B(Jac, IDX(i, 2), IDX(i + 1, 2)) += c * awconst;
  }

  /* Return with success */
  return 0;
}